

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int test_add_authentic_ip(void)

{
  code *pcVar1;
  char *__s;
  OcsAddAuthenticIPRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1b1;
  int ret;
  HttpTestListener *local_190;
  HttpTestListener *listener;
  string local_180;
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [55];
  allocator<char> local_f9;
  string local_f8 [32];
  OcsAddAuthenticIPRequestType *local_d8;
  Ocs *ocs;
  undefined1 local_c8 [7];
  OcsAddAuthenticIPResponseType resp;
  OcsAddAuthenticIPRequestType req;
  
  aliyun::OcsAddAuthenticIPRequestType::OcsAddAuthenticIPRequestType
            ((OcsAddAuthenticIPRequestType *)local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"cn-hangzhou",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"my_appid",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_158,"my_secret",&local_159);
  pOVar2 = (OcsAddAuthenticIPRequestType *)
           aliyun::Ocs::CreateOcsClient(local_f8,local_130,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  local_d8 = pOVar2;
  if (pOVar2 == (OcsAddAuthenticIPRequestType *)0x0) {
    aliyun::OcsAddAuthenticIPRequestType::~OcsAddAuthenticIPRequestType
              ((OcsAddAuthenticIPRequestType *)local_c8);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetProxyHost((Ocs *)pOVar2,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetUseTls((Ocs *)local_d8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_add_authentic_ip_response;
  local_190 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1b1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1b1);
  HttpTestListener::Start(local_190);
  std::__cxx11::string::operator=((string *)local_c8,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  std::__cxx11::string::operator=
            ((string *)(req.instance_id.field_2._M_local_buf + 8),"AuthenticIP");
  aliyun::Ocs::AddAuthenticIP
            (local_d8,(OcsAddAuthenticIPResponseType *)local_c8,(OcsErrorInfo *)((long)&ocs + 7));
  HttpTestListener::WaitComplete(local_190);
  pHVar3 = local_190;
  if (local_190 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_190);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_d8;
  if (local_d8 != (OcsAddAuthenticIPRequestType *)0x0) {
    aliyun::Ocs::~Ocs((Ocs *)local_d8);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_add_authentic_ip() {
  OcsAddAuthenticIPRequestType req;
  OcsAddAuthenticIPResponseType resp;
  Ocs* ocs = Ocs::CreateOcsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ocs) return 0;
  ocs->SetProxyHost("127.0.0.1:12234");
  ocs->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_add_authentic_ip_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  req.authentic_ip = "AuthenticIP";
  int ret = ocs->AddAuthenticIP(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ocs;
}